

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::resize(Value *this,ArrayIndex newSize)

{
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  ArrayIndex AVar1;
  runtime_error *this_01;
  CZString local_68;
  ArrayIndex local_58;
  ArrayIndex local_54;
  ArrayIndex index;
  ArrayIndex oldSize;
  ArrayIndex local_14;
  Value *pVStack_10;
  ArrayIndex newSize_local;
  Value *this_local;
  
  local_14 = newSize;
  pVStack_10 = this;
  if (((*(ushort *)&this->field_0x8 & 0xff) != 0) && ((*(ushort *)&this->field_0x8 & 0xff) != 6)) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"in Json::Value::resize(): requires arrayValue");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((*(ushort *)&this->field_0x8 & 0xff) == 0) {
    Value((Value *)&index,arrayValue);
    operator=(this,(Value *)&index);
    ~Value((Value *)&index);
  }
  local_54 = size(this);
  if (local_14 == 0) {
    clear(this);
  }
  else if (local_54 < local_14) {
    operator[](this,local_14 - 1);
  }
  else {
    for (local_58 = local_14; local_58 < local_54; local_58 = local_58 + 1) {
      this_00 = (this->value_).map_;
      CZString::CZString(&local_68,local_58);
      std::
      map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
      ::erase(this_00,&local_68);
      CZString::~CZString(&local_68);
    }
    AVar1 = size(this);
    if (AVar1 != local_14) {
      __assert_fail("size() == newSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                    ,0x345,"void Json::Value::resize(ArrayIndex)");
    }
  }
  return;
}

Assistant:

void Value::resize(ArrayIndex newSize) {
  JSON_ASSERT_MESSAGE(type_ == nullValue || type_ == arrayValue,
                      "in Json::Value::resize(): requires arrayValue");
  if (type_ == nullValue)
    *this = Value(arrayValue);
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  ArrayIndex oldSize = size();
  if (newSize == 0)
    clear();
  else if (newSize > oldSize)
    (*this)[newSize - 1];
  else {
    for (ArrayIndex index = newSize; index < oldSize; ++index) {
      value_.map_->erase(index);
    }
    assert(size() == newSize);
  }
#else
  value_.array_->resize(newSize);
#endif
}